

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O3

void Mio_LibrarySortGates(Mio_Library_t *pLib)

{
  Mio_Gate_t **__base;
  Mio_Gate_t *pMVar1;
  Mio_Gate_t **ppMVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  __base = (Mio_Gate_t **)malloc((long)pLib->nGates << 3);
  pMVar1 = Mio_LibraryReadGates(pLib);
  uVar5 = 0;
  for (; iVar4 = (int)uVar5, pMVar1 != (Mio_Gate_t *)0x0; pMVar1 = Mio_GateReadNext(pMVar1)) {
    pMVar1->Cell = iVar4;
    __base[uVar5] = pMVar1;
    uVar5 = uVar5 + 1;
  }
  if (iVar4 == pLib->nGates) {
    ppMVar2 = (Mio_Gate_t **)malloc((long)iVar4 * 8);
    pLib->ppGates0 = ppMVar2;
    if (0 < iVar4) {
      uVar3 = 0;
      do {
        pLib->ppGates0[uVar3] = __base[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uVar5 & 0xffffffff) != uVar3);
    }
    qsort(__base,(long)iVar4,8,Mio_LibraryCompareGatesByName);
    iVar4 = pLib->nGates;
    if (0 < (long)iVar4) {
      uVar5 = 0;
      do {
        if (uVar5 < iVar4 - 1) {
          pMVar1 = __base[uVar5 + 1];
        }
        else {
          pMVar1 = (Mio_Gate_t *)0x0;
        }
        __base[uVar5]->pNext = pMVar1;
        uVar5 = uVar5 + 1;
      } while ((long)iVar4 != uVar5);
    }
    pLib->pGates = *__base;
    pLib->ppGatesName = __base;
    return;
  }
  __assert_fail("i == pLib->nGates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioRead.c"
                ,0x251,"void Mio_LibrarySortGates(Mio_Library_t *)");
}

Assistant:

void Mio_LibrarySortGates( Mio_Library_t * pLib )
{
    Mio_Gate_t ** ppGates, * pGate;
    int i = 0;
    ppGates = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    Mio_LibraryForEachGate( pLib, pGate )
    {
        pGate->Cell = i;
        ppGates[i++] = pGate;
    }
    assert( i == pLib->nGates );
    // sort gates by name
    pLib->ppGates0 = ABC_ALLOC( Mio_Gate_t *, pLib->nGates );
    for ( i = 0; i < pLib->nGates; i++ )
        pLib->ppGates0[i] = ppGates[i];
    qsort( (void *)ppGates, (size_t)pLib->nGates, sizeof(void *), 
            (int (*)(const void *, const void *)) Mio_LibraryCompareGatesByName );
    for ( i = 0; i < pLib->nGates; i++ )
        ppGates[i]->pNext = (i < pLib->nGates-1)? ppGates[i+1] : NULL;
    pLib->pGates = ppGates[0];
    pLib->ppGatesName = ppGates;
}